

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_expression(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  const_pointer pcVar2;
  undefined4 uVar3;
  bool bVar4;
  Token local_40;
  
  bVar4 = parse_expression_and(this,tmpl);
  if (bVar4) {
    if ((this->m_tok).kind != Id) {
      return true;
    }
    if ((this->m_tok).text.size_ != 2) {
      return true;
    }
    if (*(short *)(this->m_tok).text.data_ != 0x726f) {
      return true;
    }
    pTVar1 = &this->m_tok;
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar3 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
      pcVar2 = (this->m_peek_tok).text.data_;
      pTVar1->kind = (this->m_peek_tok).kind;
      *(undefined4 *)&pTVar1->field_0x4 = uVar3;
      (this->m_tok).text.data_ = pcVar2;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan(&local_40,&this->m_lexer);
      (this->m_tok).text.size_ = local_40.text.size_;
      pTVar1->kind = local_40.kind;
      *(undefined4 *)&pTVar1->field_0x4 = local_40._4_4_;
      (this->m_tok).text.data_ = local_40.text.data_;
    }
    bVar4 = parse_expression_and(this,tmpl);
    if (bVar4) {
      append_function(this,tmpl,Or,2);
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_expression(Template& tmpl) {
		if (!parse_expression_and(tmpl)) return false;
		if (m_tok.kind != Token::Kind::Id || m_tok.text != "or") return true;
		get_next_token();
		if (!parse_expression_and(tmpl)) return false;
		append_function(tmpl, Bytecode::Op::Or, 2);
		return true;
	}